

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O0

void __thiscall
level_mesh::merge(level_mesh *this,b_model_instance *instance,b_model_instance *instance1)

{
  b_model_instance *instance1_local;
  b_model_instance *instance_local;
  level_mesh *this_local;
  
  change_tag(this,instance1->tag,instance1->min_face,instance1->max_face,instance->tag);
  xray_re::_aabb<float>::merge(&instance->aabb,&instance1->aabb);
  if (instance1->min_vert < instance->min_vert) {
    instance->min_vert = instance1->min_vert;
  }
  if (instance->max_vert < instance1->max_vert) {
    instance->max_vert = instance1->max_vert;
  }
  if (instance1->min_face < instance->min_face) {
    instance->min_face = instance1->min_face;
  }
  if (instance->max_face < instance1->max_face) {
    instance->max_face = instance1->max_face;
  }
  instance->num_faces = instance1->num_faces + instance->num_faces;
  return;
}

Assistant:

void level_mesh::merge(b_model_instance* instance, const b_model_instance* instance1)
{
	change_tag(instance1->tag, instance1->min_face, instance1->max_face, instance->tag);
	instance->aabb.merge(instance1->aabb);
	if (instance->min_vert > instance1->min_vert)
		instance->min_vert = instance1->min_vert;
	if (instance->max_vert < instance1->max_vert)
		instance->max_vert = instance1->max_vert;
	if (instance->min_face > instance1->min_face)
		instance->min_face = instance1->min_face;
	if (instance->max_face < instance1->max_face)
		instance->max_face = instance1->max_face;
	instance->num_faces += instance1->num_faces;
}